

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void testTimestamp(void)

{
  uint64_t t1;
  int i;
  uint64_t in_stack_ffffffffffffff68;
  Time *in_stack_ffffffffffffff70;
  C *p;
  StringRef *in_stack_ffffffffffffff90;
  Time *in_stack_ffffffffffffff98;
  C local_44 [52];
  uint64_t local_10;
  int local_4;
  
  for (local_4 = 0; local_4 < 0x14; local_4 = local_4 + 1) {
    local_10 = axl::sys::getTimestamp();
    p = local_44;
    axl::sys::Time::Time(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
    axl::sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::StringRefBase
              ((StringRefBase<char,_axl::sl::StringDetailsBase<char>_> *)&stack0xffffffffffffff98,p)
    ;
    axl::sys::Time::format(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
    in_stack_ffffffffffffff70 =
         (Time *)axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>::sz
                           ((StringBase<char,_axl::sl::StringDetailsBase<char>_> *)
                            in_stack_ffffffffffffff70);
    printf("%s: %llu\n",in_stack_ffffffffffffff70,local_10);
    axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>::~StringBase
              ((StringBase<char,_axl::sl::StringDetailsBase<char>_> *)0x10ef48);
    axl::sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::~StringRefBase
              ((StringRefBase<char,_axl::sl::StringDetailsBase<char>_> *)0x10ef52);
  }
  return;
}

Assistant:

void
testTimestamp() {
	for (int i = 0; i < 20; i++) {
		uint64_t t1 = sys::getTimestamp();
		printf("%s: %llu\n", sys::Time(t1).format("%h:%m:%s.%l.%c").sz(), t1);
	}
}